

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

ScriptDataResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::CreateMultisigScriptSigRequestStruct,cfd::js::api::ScriptDataResponseStruct>
          (ScriptDataResponseStruct *__return_storage_ptr__,api *this,
          CreateMultisigScriptSigRequestStruct *request,
          function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  ScriptDataResponseStruct local_108;
  undefined1 local_29;
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
  *call_function_local;
  CreateMultisigScriptSigRequestStruct *request_local;
  ScriptDataResponseStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = (string *)request;
  call_function_local =
       (function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
        *)this;
  request_local = (CreateMultisigScriptSigRequestStruct *)__return_storage_ptr__;
  ScriptDataResponseStruct::ScriptDataResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
  ::operator()(&local_108,
               (function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
                *)request,(CreateMultisigScriptSigRequestStruct *)call_function_local);
  ScriptDataResponseStruct::operator=(__return_storage_ptr__,&local_108);
  ScriptDataResponseStruct::~ScriptDataResponseStruct(&local_108);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}